

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

Node<ProKey,_QSet<ProKey>_> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<ProKey,_QSet<ProKey>_>_>::findNode<ProKey>
          (Data<QHashPrivate::Node<ProKey,_QSet<ProKey>_>_> *this,ProKey *key)

{
  long lVar1;
  bool bVar2;
  Node<ProKey,_QSet<ProKey>_> *pNVar3;
  ProKey *in_RDI;
  long in_FS_OFFSET;
  Bucket bucket;
  Data<QHashPrivate::Node<ProKey,_QSet<ProKey>_>_> *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  findBucket<ProKey>(in_stack_ffffffffffffffe0,in_RDI);
  bVar2 = Bucket::isUnused((Bucket *)0x2ddd9b);
  if (bVar2) {
    pNVar3 = (Node<ProKey,_QSet<ProKey>_> *)0x0;
  }
  else {
    pNVar3 = Bucket::node((Bucket *)0x2dddb6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pNVar3;
  }
  __stack_chk_fail();
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }